

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O3

TestSuite * parameter_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("parameter_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
                      ,0x9d);
  set_teardown(pTVar1,destroy_names);
  add_test_(pTVar1,"can_create_vector_of_no_parameters_and_destroy_it",
            &CgreenSpec__default__can_create_vector_of_no_parameters_and_destroy_it__);
  add_test_(pTVar1,"can_read_single_parameter",&CgreenSpec__default__can_read_single_parameter__);
  add_test_(pTVar1,"can_read_two_parameters",&CgreenSpec__default__can_read_two_parameters__);
  add_test_(pTVar1,"can_read_three_parameters",&CgreenSpec__default__can_read_three_parameters__);
  add_test_(pTVar1,"can_read_two_parameters_without_spaces",
            &CgreenSpec__default__can_read_two_parameters_without_spaces__);
  add_test_(pTVar1,"can_read_long_parameters",&CgreenSpec__default__can_read_long_parameters__);
  add_test_(pTVar1,"can_read_long_parameters_with_funky_names",
            &CgreenSpec__default__can_read_long_parameters_with_funky_names__);
  add_test_(pTVar1,"can_read_two_parameters_with_varied_whitespace",
            &CgreenSpec__default__can_read_two_parameters_with_varied_whitespace__);
  add_test_(pTVar1,"can_strip_box_double_to_leave_original_name",
            &CgreenSpec__default__can_strip_box_double_to_leave_original_name__);
  add_test_(pTVar1,"can_strip_two_box_doubles_to_leave_original_names",
            &CgreenSpec__default__can_strip_two_box_doubles_to_leave_original_names__);
  add_test_(pTVar1,"can_strip_d_macro_to_leave_original_name",
            &CgreenSpec__default__can_strip_d_macro_to_leave_original_name__);
  add_test_(pTVar1,"can_strip_two_d_macros_to_leave_original_names",
            &CgreenSpec__default__can_strip_two_d_macros_to_leave_original_names__);
  add_test_(pTVar1,"can_strip_d_macro_and_box_double_to_leave_original_names",
            &CgreenSpec__default__can_strip_d_macro_and_box_double_to_leave_original_names__);
  add_test_(pTVar1,"can_strip_box_double_and_d_macro_to_leave_original_names",
            &CgreenSpec__default__can_strip_box_double_and_d_macro_to_leave_original_names__);
  add_test_(pTVar1,"can_strip_multiple_mixed_parameters_to_leave_original_names",
            &CgreenSpec__default__can_strip_multiple_mixed_parameters_to_leave_original_names__);
  return pTVar1;
}

Assistant:

TestSuite *parameter_tests(void) {
    TestSuite *suite = create_test_suite();
    set_teardown(suite, destroy_names);
    add_test(suite, can_create_vector_of_no_parameters_and_destroy_it);
    add_test(suite, can_read_single_parameter);
    add_test(suite, can_read_two_parameters);
    add_test(suite, can_read_three_parameters);
    add_test(suite, can_read_two_parameters_without_spaces);
    add_test(suite, can_read_long_parameters);
    add_test(suite, can_read_long_parameters_with_funky_names);
    add_test(suite, can_read_two_parameters_with_varied_whitespace);
    add_test(suite, can_strip_box_double_to_leave_original_name);
    add_test(suite, can_strip_two_box_doubles_to_leave_original_names);
    add_test(suite, can_strip_d_macro_to_leave_original_name);
    add_test(suite, can_strip_two_d_macros_to_leave_original_names);
    add_test(suite, can_strip_d_macro_and_box_double_to_leave_original_names);
    add_test(suite, can_strip_box_double_and_d_macro_to_leave_original_names);
    add_test(suite, can_strip_multiple_mixed_parameters_to_leave_original_names);
    return suite;
}